

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcActor::IfcActor(IfcActor *this)

{
  *(undefined ***)&this->field_0xf0 = &PTR__Object_007261d0;
  *(undefined8 *)&this->field_0xf8 = 0;
  *(char **)&this->field_0x100 = "IfcActor";
  IfcObject::IfcObject(&this->super_IfcObject,&PTR_construction_vtable_24__00759070);
  *(undefined8 *)&(this->super_IfcObject).field_0xd8 = 0;
  *(undefined8 *)&this->super_IfcObject = 0x758fb8;
  *(undefined8 *)&this->field_0xf0 = 0x759058;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0x758fe0;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x759008;
  *(undefined8 *)&(this->super_IfcObject).field_0xd0 = 0x759030;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0;
  *(undefined8 *)&this->field_0xe8 = 0;
  return;
}

Assistant:

IfcActor() : Object("IfcActor") {}